

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::parse_disguised_long_option
          (command_line_parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  reference pvVar1;
  ulong uVar2;
  char *pcVar3;
  option_description *poVar4;
  undefined1 *puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  command_line_parser *in_RSI;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *in_RDI;
  error_with_option_name *e;
  string *tok;
  string local_40 [5];
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  string *in_stack_ffffffffffffffc8;
  options_description *in_stack_ffffffffffffffd0;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDX,0);
  uVar2 = std::__cxx11::string::size();
  if ((1 < uVar2) &&
     (((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1), *pcVar3 == '-' &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1), *pcVar3 != '-')) ||
      (((in_RSI->m_style & allow_slash_for_short) != 0 &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1), *pcVar3 == '/')))))) {
    std::__cxx11::string::find((char)pvVar1,0x3d);
    std::__cxx11::string::substr((ulong)local_40,(ulong)pvVar1);
    is_style_active(in_RSI,allow_guessing);
    is_style_active(in_RSI,long_case_insensitive);
    is_style_active(in_RSI,short_case_insensitive);
    poVar4 = options_description::find_nothrow
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                        (bool)in_stack_ffffffffffffffc7,(bool)in_stack_ffffffffffffffc6,
                        (bool)in_stack_ffffffffffffffc5);
    std::__cxx11::string::~string(local_40);
    if (poVar4 != (option_description *)0x0) {
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RDX,0);
      std::__cxx11::string::insert((ulong)pvVar1,(char *)0x0);
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RDX,0);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1);
      if (*pcVar3 == '/') {
        pvVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](in_RDX,0);
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)pvVar1);
        *puVar5 = 0x2d;
      }
      parse_long_option(this,args);
      return in_RDI;
    }
  }
  memset(in_RDI,0,0x18);
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            *)0x200600);
  return in_RDI;
}

Assistant:

std::vector<option>
command_line_parser::parse_disguised_long_option(std::vector<std::string>& args)
{
    const std::string& tok = args[0];
    if (tok.size() >= 2 &&
            ((tok[0] == '-' && tok[1] != '-') ||
             ((m_style & command_line_style::allow_slash_for_short) && tok[0] == '/')))
    {
        try
        {
            if (m_options_description->find_nothrow(
                tok.substr(1, tok.find('=')-1),
                is_style_active(command_line_style::allow_guessing),
                is_style_active(command_line_style::long_case_insensitive),
                is_style_active(command_line_style::short_case_insensitive)))
            {
                args[0].insert(0, "-");
                if (args[0][1] == '/')
                    args[0][1] = '-';
                return parse_long_option(args);
            }
        }
        catch(error_with_option_name& e)
        {
            // add context and rethrow
            e.add_context(tok, tok, get_canonical_option_prefix());
            throw;
        }
    }
    return std::vector<option>();
}